

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O2

void __thiscall VmaBlockMetadata_Linear::CleanupAfterFree(VmaBlockMetadata_Linear *this)

{
  size_t *psVar1;
  ulong uVar2;
  size_t sVar3;
  VmaSuballocation *pVVar4;
  bool bVar5;
  VkDeviceSize VVar6;
  VkDeviceSize VVar7;
  undefined8 uVar8;
  VmaSuballocationType *pVVar9;
  bool bVar10;
  int iVar11;
  size_t sVar12;
  ulong uVar13;
  size_t sVar14;
  ulong uVar15;
  ulong uVar16;
  VmaSuballocationType *pVVar17;
  long lVar18;
  size_t newCount;
  VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_> *this_00;
  VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_> *this_01;
  bool bVar19;
  
  bVar19 = this->m_1stVectorIndex == 0;
  bVar5 = !bVar19;
  this_01 = &this->m_Suballocations0 + bVar5;
  this_00 = &this->m_Suballocations0 + bVar19;
  iVar11 = (*(this->super_VmaBlockMetadata)._vptr_VmaBlockMetadata[7])();
  if ((char)iVar11 == '\0') {
    psVar1 = &this->m_1stNullItemsBeginCount;
    uVar2 = (&this->m_Suballocations0)[bVar5].m_Count;
    uVar16 = this->m_1stNullItemsBeginCount;
    sVar3 = this->m_1stNullItemsMiddleCount;
    sVar12 = sVar3;
    uVar15 = uVar16;
    for (uVar13 = uVar16 << 5 | 0x18;
        (uVar15 < uVar2 &&
        (*(int *)((long)&((&this->m_Suballocations0)[bVar5].m_pArray)->offset + uVar13) == 0));
        uVar13 = uVar13 + 0x20) {
      uVar15 = uVar15 + 1;
      this->m_1stNullItemsBeginCount = uVar15;
      sVar12 = sVar12 - 1;
      this->m_1stNullItemsMiddleCount = sVar12;
    }
    while ((sVar12 != 0 &&
           ((&this->m_Suballocations0)[bVar5].m_pArray
            [(&this->m_Suballocations0)[bVar5].m_Count - 1].type == VMA_SUBALLOCATION_TYPE_FREE))) {
      this->m_1stNullItemsMiddleCount = sVar12 - 1;
      VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_>::pop_back(this_01);
      sVar12 = this->m_1stNullItemsMiddleCount;
    }
    while ((sVar12 = this->m_2ndNullItemsCount, sVar12 != 0 &&
           ((&this->m_Suballocations0)[bVar19].m_pArray
            [(&this->m_Suballocations0)[bVar19].m_Count - 1].type == VMA_SUBALLOCATION_TYPE_FREE)))
    {
      this->m_2ndNullItemsCount = sVar12 - 1;
      VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_>::pop_back(this_00);
    }
    while ((sVar12 != 0 &&
           (((&this->m_Suballocations0)[bVar19].m_pArray)->type == VMA_SUBALLOCATION_TYPE_FREE))) {
      this->m_2ndNullItemsCount = sVar12 - 1;
      VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_>::remove(this_00,(char *)0x0);
      sVar12 = this->m_2ndNullItemsCount;
    }
    bVar10 = ShouldCompact1st(this);
    if (bVar10) {
      newCount = uVar2 - (uVar16 + sVar3);
      sVar12 = *psVar1;
      sVar3 = 0;
      while (sVar14 = sVar3, sVar14 != newCount) {
        pVVar4 = (&this->m_Suballocations0)[bVar5].m_pArray;
        pVVar9 = &pVVar4[sVar12].type;
        do {
          pVVar17 = pVVar9;
          sVar12 = sVar12 + 1;
          pVVar9 = pVVar17 + 8;
        } while (*pVVar17 == VMA_SUBALLOCATION_TYPE_FREE);
        sVar3 = sVar14 + 1;
        if (sVar3 != sVar12) {
          VVar6 = ((VmaSuballocation *)(pVVar17 + -6))->offset;
          VVar7 = *(VkDeviceSize *)(pVVar17 + -4);
          uVar8 = *(undefined8 *)pVVar17;
          pVVar4[sVar14].userData = *(void **)(pVVar17 + -2);
          (&pVVar4[sVar14].userData)[1] = (void *)uVar8;
          pVVar4[sVar14].offset = VVar6;
          pVVar4[sVar14].size = VVar7;
        }
      }
      VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_>::resize(this_01,newCount);
      *psVar1 = 0;
      this->m_1stNullItemsMiddleCount = 0;
    }
    if ((&this->m_Suballocations0)[bVar19].m_Count == 0) {
      this->m_2ndVectorMode = SECOND_VECTOR_EMPTY;
    }
    if ((&this->m_Suballocations0)[bVar5].m_Count == *psVar1) {
      VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_>::clear(this_01);
      *psVar1 = 0;
      uVar2 = (&this->m_Suballocations0)[bVar19].m_Count;
      if ((uVar2 != 0) && (this->m_2ndVectorMode == SECOND_VECTOR_RING_BUFFER)) {
        this->m_2ndVectorMode = SECOND_VECTOR_EMPTY;
        uVar16 = 0;
        for (lVar18 = 0x18;
            (uVar16 < uVar2 &&
            (*(int *)((long)&((&this->m_Suballocations0)[bVar19].m_pArray)->offset + lVar18) == 0));
            lVar18 = lVar18 + 0x20) {
          uVar16 = uVar16 + 1;
          *psVar1 = uVar16;
        }
        this->m_1stNullItemsMiddleCount = this->m_2ndNullItemsCount - uVar16;
        this->m_2ndNullItemsCount = 0;
        *(byte *)&this->m_1stVectorIndex = (byte)this->m_1stVectorIndex ^ 1;
      }
    }
  }
  else {
    VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_>::clear(this_01);
    VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_>::clear(this_00);
    this->m_1stNullItemsMiddleCount = 0;
    this->m_2ndNullItemsCount = 0;
    *(undefined8 *)&this->m_2ndVectorMode = 0;
    *(undefined8 *)((long)&this->m_1stNullItemsBeginCount + 4) = 0;
  }
  return;
}

Assistant:

void VmaBlockMetadata_Linear::CleanupAfterFree()
{
    SuballocationVectorType& suballocations1st = AccessSuballocations1st();
    SuballocationVectorType& suballocations2nd = AccessSuballocations2nd();

    if (IsEmpty())
    {
        suballocations1st.clear();
        suballocations2nd.clear();
        m_1stNullItemsBeginCount = 0;
        m_1stNullItemsMiddleCount = 0;
        m_2ndNullItemsCount = 0;
        m_2ndVectorMode = SECOND_VECTOR_EMPTY;
    }
    else
    {
        const size_t suballoc1stCount = suballocations1st.size();
        const size_t nullItem1stCount = m_1stNullItemsBeginCount + m_1stNullItemsMiddleCount;
        VMA_ASSERT(nullItem1stCount <= suballoc1stCount);

        // Find more null items at the beginning of 1st vector.
        while (m_1stNullItemsBeginCount < suballoc1stCount &&
            suballocations1st[m_1stNullItemsBeginCount].type == VMA_SUBALLOCATION_TYPE_FREE)
        {
            ++m_1stNullItemsBeginCount;
            --m_1stNullItemsMiddleCount;
        }

        // Find more null items at the end of 1st vector.
        while (m_1stNullItemsMiddleCount > 0 &&
            suballocations1st.back().type == VMA_SUBALLOCATION_TYPE_FREE)
        {
            --m_1stNullItemsMiddleCount;
            suballocations1st.pop_back();
        }

        // Find more null items at the end of 2nd vector.
        while (m_2ndNullItemsCount > 0 &&
            suballocations2nd.back().type == VMA_SUBALLOCATION_TYPE_FREE)
        {
            --m_2ndNullItemsCount;
            suballocations2nd.pop_back();
        }

        // Find more null items at the beginning of 2nd vector.
        while (m_2ndNullItemsCount > 0 &&
            suballocations2nd[0].type == VMA_SUBALLOCATION_TYPE_FREE)
        {
            --m_2ndNullItemsCount;
            VmaVectorRemove(suballocations2nd, 0);
        }

        if (ShouldCompact1st())
        {
            const size_t nonNullItemCount = suballoc1stCount - nullItem1stCount;
            size_t srcIndex = m_1stNullItemsBeginCount;
            for (size_t dstIndex = 0; dstIndex < nonNullItemCount; ++dstIndex)
            {
                while (suballocations1st[srcIndex].type == VMA_SUBALLOCATION_TYPE_FREE)
                {
                    ++srcIndex;
                }
                if (dstIndex != srcIndex)
                {
                    suballocations1st[dstIndex] = suballocations1st[srcIndex];
                }
                ++srcIndex;
            }
            suballocations1st.resize(nonNullItemCount);
            m_1stNullItemsBeginCount = 0;
            m_1stNullItemsMiddleCount = 0;
        }

        // 2nd vector became empty.
        if (suballocations2nd.empty())
        {
            m_2ndVectorMode = SECOND_VECTOR_EMPTY;
        }

        // 1st vector became empty.
        if (suballocations1st.size() - m_1stNullItemsBeginCount == 0)
        {
            suballocations1st.clear();
            m_1stNullItemsBeginCount = 0;

            if (!suballocations2nd.empty() && m_2ndVectorMode == SECOND_VECTOR_RING_BUFFER)
            {
                // Swap 1st with 2nd. Now 2nd is empty.
                m_2ndVectorMode = SECOND_VECTOR_EMPTY;
                m_1stNullItemsMiddleCount = m_2ndNullItemsCount;
                while (m_1stNullItemsBeginCount < suballocations2nd.size() &&
                    suballocations2nd[m_1stNullItemsBeginCount].type == VMA_SUBALLOCATION_TYPE_FREE)
                {
                    ++m_1stNullItemsBeginCount;
                    --m_1stNullItemsMiddleCount;
                }
                m_2ndNullItemsCount = 0;
                m_1stVectorIndex ^= 1;
            }
        }
    }

    VMA_HEAVY_ASSERT(Validate());
}